

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetListenerfv(void)

{
  ALenum param_00;
  uint32 numvals_00;
  ALfloat *origvalues_00;
  float fVar1;
  ALfloat *local_260;
  uint local_254;
  uint32 i;
  ALfloat *values;
  uint32 numvals;
  ALfloat *origvalues;
  undefined1 local_230 [4];
  ALenum param;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)local_230);
  if (io_failure == 0) {
    param_00 = IO_ENUM();
    origvalues_00 = (ALfloat *)IO_PTR();
    numvals_00 = IO_UINT32();
    if (numvals_00 == 0) {
      local_260 = (ALfloat *)0x0;
    }
    else {
      local_260 = (ALfloat *)get_ioblob((ulong)numvals_00 << 2);
    }
    for (local_254 = 0; local_254 < numvals_00; local_254 = local_254 + 1) {
      fVar1 = IO_FLOAT();
      local_260[local_254] = fVar1;
    }
    if (io_failure == 0) {
      visit_alGetListenerfv((CallerInfo *)local_230,param_00,origvalues_00,numvals_00,local_260);
    }
  }
  return;
}

Assistant:

static void decode_alGetListenerfv(void)
{
    IO_START(alGetListenerfv);
    const ALenum param = IO_ENUM();
    ALfloat *origvalues = (ALfloat *) IO_PTR();
    const uint32 numvals = IO_UINT32();
    ALfloat *values = (ALfloat *) (numvals ? get_ioblob(sizeof (ALfloat) * numvals) : NULL);
    uint32 i;

    for (i = 0; i < numvals; i++) {
        values[i] = IO_FLOAT();
    }

    if (!io_failure) visit_alGetListenerfv(&callerinfo, param, origvalues, numvals, values);

    IO_END();
}